

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmArchiveWrite.cxx
# Opt level: O0

la_ssize_t cmArchiveWrite::Callback::Write(archive *param_1,void *cd,void *b,size_t n)

{
  bool bVar1;
  long *plVar2;
  cmArchiveWrite *self;
  size_t n_local;
  void *b_local;
  void *cd_local;
  archive *param_0_local;
  
  plVar2 = (long *)std::ostream::write(*cd,(long)b);
  bVar1 = std::ios::operator_cast_to_bool((ios *)((long)plVar2 + *(long *)(*plVar2 + -0x18)));
  param_0_local = (archive *)n;
  if (!bVar1) {
    param_0_local = (archive *)0xffffffffffffffff;
  }
  return (la_ssize_t)param_0_local;
}

Assistant:

static __LA_SSIZE_T Write(struct archive*, void *cd,
                            const void *b, size_t n)
    {
    cmArchiveWrite* self = static_cast<cmArchiveWrite*>(cd);
    if(self->Stream.write(static_cast<const char*>(b),
                          static_cast<std::streamsize>(n)))
      {
      return static_cast<__LA_SSIZE_T>(n);
      }
    else
      {
      return static_cast<__LA_SSIZE_T>(-1);
      }
    }